

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser.cpp
# Opt level: O0

void argo::unparser::unparse
               (ostream *o,json *j,char *space,char *newline,char *indent,int indent_inc)

{
  undefined1 local_70 [8];
  unparser u;
  stream_writer w;
  int indent_inc_local;
  char *indent_local;
  char *newline_local;
  char *space_local;
  json *j_local;
  ostream *o_local;
  
  stream_writer::stream_writer((stream_writer *)&u.m_indent_inc,o);
  unparser((unparser *)local_70,(writer *)&u.m_indent_inc,space,newline,indent,indent_inc);
  unparse((unparser *)local_70,j,0);
  stream_writer::~stream_writer((stream_writer *)&u.m_indent_inc);
  return;
}

Assistant:

void unparser::unparse(
        ostream    &o,
        const json &j,
        const char *space,
        const char *newline,
        const char *indent,
        int        indent_inc)
{
    stream_writer w(&o);
    unparser u(w, space, newline, indent, indent_inc);
    u.unparse(j, 0);
}